

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

xmlChar * xmlValidNormalizeAttributeValue
                    (xmlDocPtr doc,xmlNodePtr elem,xmlChar *name,xmlChar *value)

{
  xmlChar **ppxVar1;
  xmlChar *fullname;
  xmlChar fn [50];
  xmlAttributePtr attrDecl;
  xmlChar *src;
  xmlChar *dst;
  xmlChar *ret;
  xmlChar *value_local;
  xmlChar *name_local;
  xmlNodePtr elem_local;
  xmlDocPtr doc_local;
  
  stack0xffffffffffffffb0 = (xmlAttributePtr)0x0;
  if (doc == (xmlDocPtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if (elem == (xmlNodePtr)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if (name == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else if (value == (xmlChar *)0x0) {
    doc_local = (xmlDocPtr)0x0;
  }
  else {
    if ((elem->ns != (xmlNs *)0x0) && (elem->ns->prefix != (xmlChar *)0x0)) {
      ppxVar1 = (xmlChar **)xmlBuildQName(elem->name,elem->ns->prefix,(xmlChar *)&fullname,0x32);
      if (ppxVar1 == (xmlChar **)0x0) {
        return (xmlChar *)0x0;
      }
      if ((ppxVar1 != &fullname) && (ppxVar1 != (xmlChar **)elem->name)) {
        (*xmlFree)(ppxVar1);
      }
    }
    register0x00000000 = xmlGetDtdAttrDesc(doc->intSubset,elem->name,name);
    if ((register0x00000000 == (xmlAttributePtr)0x0) && (doc->extSubset != (_xmlDtd *)0x0)) {
      register0x00000000 = xmlGetDtdAttrDesc(doc->extSubset,elem->name,name);
    }
    if (stack0xffffffffffffffb0 == (xmlAttributePtr)0x0) {
      doc_local = (xmlDocPtr)0x0;
    }
    else if (stack0xffffffffffffffb0->atype == XML_ATTRIBUTE_CDATA) {
      doc_local = (xmlDocPtr)0x0;
    }
    else {
      doc_local = (xmlDocPtr)xmlStrdup(value);
      attrDecl = (xmlAttributePtr)value;
      if (doc_local == (xmlDocPtr)0x0) {
        doc_local = (xmlDocPtr)0x0;
      }
      else {
        for (; src = (xmlChar *)doc_local, *(char *)&attrDecl->_private == ' ';
            attrDecl = (xmlAttributePtr)((long)&attrDecl->_private + 1)) {
        }
        while (*(char *)&attrDecl->_private != '\0') {
          if (*(char *)&attrDecl->_private == ' ') {
            for (; *(char *)&attrDecl->_private == ' ';
                attrDecl = (xmlAttributePtr)((long)&attrDecl->_private + 1)) {
            }
            if (*(char *)&attrDecl->_private != '\0') {
              *src = ' ';
              src = src + 1;
            }
          }
          else {
            *src = *(xmlChar *)&attrDecl->_private;
            attrDecl = (xmlAttributePtr)((long)&attrDecl->_private + 1);
            src = src + 1;
          }
        }
        *src = '\0';
      }
    }
  }
  return (xmlChar *)doc_local;
}

Assistant:

xmlChar *
xmlValidNormalizeAttributeValue(xmlDocPtr doc, xmlNodePtr elem,
			        const xmlChar *name, const xmlChar *value) {
    xmlChar *ret, *dst;
    const xmlChar *src;
    xmlAttributePtr attrDecl = NULL;

    if (doc == NULL) return(NULL);
    if (elem == NULL) return(NULL);
    if (name == NULL) return(NULL);
    if (value == NULL) return(NULL);

    if ((elem->ns != NULL) && (elem->ns->prefix != NULL)) {
	xmlChar fn[50];
	xmlChar *fullname;

	fullname = xmlBuildQName(elem->name, elem->ns->prefix, fn, 50);
	if (fullname == NULL)
	    return(NULL);
	if ((fullname != fn) && (fullname != elem->name))
	    xmlFree(fullname);
    }
    attrDecl = xmlGetDtdAttrDesc(doc->intSubset, elem->name, name);
    if ((attrDecl == NULL) && (doc->extSubset != NULL))
	attrDecl = xmlGetDtdAttrDesc(doc->extSubset, elem->name, name);

    if (attrDecl == NULL)
	return(NULL);
    if (attrDecl->atype == XML_ATTRIBUTE_CDATA)
	return(NULL);

    ret = xmlStrdup(value);
    if (ret == NULL)
	return(NULL);
    src = value;
    dst = ret;
    while (*src == 0x20) src++;
    while (*src != 0) {
	if (*src == 0x20) {
	    while (*src == 0x20) src++;
	    if (*src != 0)
		*dst++ = 0x20;
	} else {
	    *dst++ = *src++;
	}
    }
    *dst = 0;
    return(ret);
}